

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::IslamicCalendar::handleGetMonthLength
          (IslamicCalendar *this,int32_t extendedYear,int32_t month)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  IslamicCalendar *this_00;
  
  uVar1 = *(uint *)&(this->super_Calendar).field_0x264;
  if (3 < (ulong)uVar1) {
LAB_001e93d4:
    return ((*(uint *)(Calendar::kDOWPrecedence + (long)extendedYear * 4 + 0x2d0) >>
             ((byte)(0xb - (char)month) & 0x1f) & 1) != 0) + 0x1d;
  }
  this_00 = (IslamicCalendar *)
            ((long)&switchD_001e935f::switchdataD_002f2c00 +
            (long)(int)(&switchD_001e935f::switchdataD_002f2c00)[uVar1]);
  switch(uVar1) {
  default:
switchD_001e935f_caseD_1:
    iVar4 = (month - ((month - (month + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 0x1e;
    if ((month == 0xb) &&
       (iVar2 = (int)((ulong)((long)(extendedYear * 0xb + 0xe) * -0x77777777) >> 0x20) +
                extendedYear * 0xb + 0xe,
       ((iVar2 >> 4) - (iVar2 >> 0x1f)) * -0x1e + extendedYear * 0xb + 0xe < 0xb)) {
      iVar4 = 0x1e;
    }
    break;
  case 2:
    if (extendedYear - 0x641U < 0xfffffed3) goto switchD_001e935f_caseD_1;
    if (uVar1 != 0) goto LAB_001e93d4;
  case 0:
    iVar4 = trueMonthStart(this_00,month + extendedYear * 0xc + -0xb);
    iVar3 = trueMonthStart(this_00,month + extendedYear * 0xc + -0xc);
    iVar4 = iVar4 - iVar3;
  }
  return iVar4;
}

Assistant:

int32_t IslamicCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {

    int32_t length = 0;

    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (extendedYear<UMALQURA_YEAR_START || extendedYear>UMALQURA_YEAR_END)) ) {
        length = 29 + (month+1) % 2;
        if (month == DHU_AL_HIJJAH && civilLeapYear(extendedYear)) {
            length++;
        }
    } else if(cType == ASTRONOMICAL){
        month = 12*(extendedYear-1) + month;
        length =  trueMonthStart(month+1) - trueMonthStart(month) ;
    } else {
        length = getUmalqura_MonthLength(extendedYear - UMALQURA_YEAR_START, month);
    }
    return length;
}